

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O2

int testCTestResourceSpec(int argc,char **argv)

{
  _Base_ptr p_Var1;
  pointer pEVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  pointer pEVar8;
  cmCTestResourceSpec local_d0;
  string path;
  
  pEVar2 = expectedResourceSpecs.super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    iVar6 = -1;
  }
  else {
    p_Var1 = &local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header;
    iVar6 = 0;
    for (pEVar8 = expectedResourceSpecs.
                  super__Vector_base<ExpectedSpec,_std::allocator<ExpectedSpec>_>._M_impl.
                  super__Vector_impl_data._M_start; pEVar8 != pEVar2; pEVar8 = pEVar8 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path,argv[1],(allocator<char> *)&local_d0);
      std::__cxx11::string::append((char *)&path);
      std::__cxx11::string::append((string *)&path);
      bVar4 = pEVar8->ParseResult;
      local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_d0.parseState.errors.
      super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.parseState.errors.
      super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.parseState.parseStack.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0.parseState.parseStack.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0.parseState.parseStack.
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0.parseState.errors.
      super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d0.parseState.doc._M_dataplus._M_p = (pointer)&local_d0.parseState.doc.field_2;
      local_d0.parseState.doc._M_string_length = 0;
      local_d0.parseState.doc.field_2._M_local_buf[0] = '\0';
      local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
      local_d0.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
      bVar3 = cmCTestResourceSpec::ReadFromJSONFile(&local_d0,&path);
      if (bVar3 == bVar4) {
        bVar4 = cmCTestResourceSpec::operator!=(&local_d0,&pEVar8->Expected);
        if (bVar4) {
          poVar5 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
          poVar5 = std::operator<<(poVar5,(string *)&path);
          pcVar7 = "\") did not give expected spec";
          goto LAB_00197e30;
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
        poVar5 = std::operator<<(poVar5,(string *)&path);
        pcVar7 = "\") failed \"";
LAB_00197e30:
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar6 = -1;
      }
      cmCTestResourceSpec::~cmCTestResourceSpec(&local_d0);
      std::__cxx11::string::~string((string *)&path);
    }
  }
  return iVar6;
}

Assistant:

int testCTestResourceSpec(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  for (auto const& spec : expectedResourceSpecs) {
    std::string path = argv[1];
    path += "/testCTestResourceSpec_data/";
    path += spec.Path;
    if (!testSpec(path, spec.ParseResult, spec.Expected)) {
      retval = -1;
    }
  }

  return retval;
}